

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

ostream * doctest::Color::operator<<(ostream *s,Enum code)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  long in_FS_OFFSET;
  
  if (*(char *)(in_FS_OFFSET + -0x38) == '\0') {
    iVar1 = isatty(1);
    if ((iVar1 != 0) || (*(char *)(detail::g_cs + 0x7d) != '\0')) {
      if (code - Red < 0x16) {
        __s = &DAT_0012b154 + *(int *)(&DAT_0012b154 + (ulong)(code - Red) * 4);
      }
      else {
        __s = "[0m";
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,"\x1b",1);
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(s,__s,sVar2);
    }
  }
  return s;
}

Assistant:

std::ostream& operator<<(std::ostream& s, Color::Enum code) {
        color_to_stream(s, code);
        return s;
    }